

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source.cpp
# Opt level: O0

void __thiscall Json::addToHolder(Json *this,string *s)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_any>_>::value,_pair<iterator,_bool>_>
  _Var4;
  Json local_270;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_238;
  _Base_ptr local_208;
  undefined1 local_200;
  int local_1f4;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_1f0;
  _Base_ptr local_1c0;
  undefined1 local_1b8;
  bool local_1a9;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_1a8;
  _Base_ptr local_178;
  undefined1 local_170;
  bool local_161;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_160;
  _Base_ptr local_130;
  undefined1 local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  local_100;
  string local_d0 [32];
  undefined1 local_b0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  undefined1 local_60 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> key;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> substring;
  size_t offset;
  string *s_local;
  Json *this_local;
  
  do {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
  } while (*pcVar3 == ' ');
  std::__cxx11::string::substr((ulong)(&key.field_2._M_allocated_capacity + 1),(ulong)s);
  std::__cxx11::string::find_first_of((char)s,0x3a);
  std::__cxx11::string::substr((ulong)local_60,(ulong)(&key.field_2._M_allocated_capacity + 1));
  std::__cxx11::string::length();
  do {
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_60);
  } while (*pcVar3 == ' ');
  std::__cxx11::string::substr((ulong)((long)&value.field_2 + 8),(ulong)local_60);
  std::__cxx11::string::operator=((string *)local_60,(string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::find_first_of((char)s,0x3a);
  std::__cxx11::string::substr((ulong)local_b0,(ulong)((long)&key.field_2 + 8));
  do {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)s);
  } while (*pcVar3 == ' ');
  std::__cxx11::string::substr((ulong)local_d0,(ulong)local_b0);
  std::__cxx11::string::operator=((string *)local_b0,local_d0);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::length();
  do {
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_b0);
  } while (*pcVar3 == ' ');
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_b0);
  if (*pcVar3 == '\"') {
    std::__cxx11::string::length();
    std::__cxx11::string::substr((ulong)&local_120,(ulong)local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (&local_100,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
               &local_120);
    _Var4 = std::
            map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
            ::insert<std::pair<std::__cxx11::string,std::any>>
                      ((map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                        *)this,&local_100);
    local_130 = (_Base_ptr)_Var4.first._M_node;
    local_128 = _Var4.second;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
    ::~pair(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b0,"true");
    if (bVar1) {
      local_161 = true;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_true>
                (&local_160,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                 &local_161);
      _Var4 = std::
              map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
              ::insert<std::pair<std::__cxx11::string,std::any>>
                        ((map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                          *)this,&local_160);
      local_178 = (_Base_ptr)_Var4.first._M_node;
      local_170 = _Var4.second;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
      ::~pair(&local_160);
    }
    else {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_b0,"false");
      if (bVar1) {
        local_1a9 = false;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_bool,_true>
                  (&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_1a9);
        _Var4 = std::
                map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                ::insert<std::pair<std::__cxx11::string,std::any>>
                          ((map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                            *)this,&local_1a8);
        local_1c0 = (_Base_ptr)_Var4.first._M_node;
        local_1b8 = _Var4.second;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
        ::~pair(&local_1a8);
      }
      else {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_b0);
        iVar2 = isdigit((int)*pcVar3);
        if (iVar2 == 0) {
          Json(&local_270,(string *)local_b0);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_Json,_true>
                    (&local_238,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_270);
          std::
          map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
          ::insert<std::pair<std::__cxx11::string,std::any>>
                    ((map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                      *)this,&local_238);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::~pair(&local_238);
          ~Json(&local_270);
        }
        else {
          local_1f4 = std::__cxx11::stoi((string *)local_b0,(size_t *)0x0,10);
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int,_true>
                    (&local_1f0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                     &local_1f4);
          _Var4 = std::
                  map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                  ::insert<std::pair<std::__cxx11::string,std::any>>
                            ((map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>
                              *)this,&local_1f0);
          local_208 = (_Base_ptr)_Var4.first._M_node;
          local_200 = _Var4.second;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
          ::~pair(&local_1f0);
        }
      }
    }
  }
  std::__cxx11::string::~string((string *)local_b0);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)(key.field_2._M_local_buf + 8));
  return;
}

Assistant:

void Json::addToHolder(const std::string& s) {
    std::size_t offset = 0;
    while (s[offset] == ' ') offset++;
    auto substring = s.substr(offset);
    auto key = substring.substr(1, s.find_first_of(':')-1);
    offset = key.length() - 1;
    while (key[key.length() - 1] == ' ') offset--;
    key = key.substr(0, offset);
    auto value = substring.substr(s.find_first_of(':'));
    offset = 0;
    while (s[offset] == ' ') offset++;
    value = value.substr(offset + 1);
    offset = value.length() - 1;
    while (value[offset] == ' ') offset--;
    if (value[0] == '"') {
        holder.insert(holderPair(key, value.substr(1, value.length() - 2)));
    } else if (value == "true") {
        holder.insert(holderPair(key, true));
    } else if (value == "false") {
        holder.insert(holderPair(key, false));
    } else if (isdigit(value[0])) {
        holder.insert(holderPair(key, std::stoi(value)));
    } else {
        holder.insert(holderPair(key, Json(value)));
    }
}